

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

string * rlib::operator<<(std::ostream&,rlib::JsonT<void>::Stringify_const&)::F::replaceString(std::
         __cxx11::string_const&,std::pair<std::__cxx11::basic_regex<char,std::__cxx11::
         regex_traits<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
         string_>_>_>_const__
                   (string *s,
                   pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *rr)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end_00;
  bool bVar1;
  undefined1 uVar2;
  allocator<char> *paVar3;
  long in_RDX;
  string *in_RDI;
  value_type *submatch;
  size_t i;
  smatch m;
  const_iterator it;
  string *r;
  const_reference in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffec0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  undefined1 local_109 [49];
  string local_d8 [32];
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_b8;
  allocator<char> *local_b0;
  int local_a8;
  undefined1 local_a1 [49];
  undefined8 local_70;
  char *local_68;
  undefined8 local_30;
  char *local_28;
  undefined1 local_19;
  long local_18;
  
  local_19 = 0;
  __beg._M_current = (char *)in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI);
  local_28 = (char *)std::__cxx11::string::cbegin();
  do {
    local_30 = std::__cxx11::string::cend();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar1) {
      return in_RDI;
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)in_stack_fffffffffffffeb0);
    local_68 = local_28;
    local_70 = std::__cxx11::string::cend();
    uVar2 = std::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
                       ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                        in_stack_fffffffffffffeb8,
                       (match_flag_type)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    if ((bool)uVar2) {
      local_b0 = (allocator<char> *)0x1;
      while (in_stack_fffffffffffffec8._M_current = (char *)local_b0,
            paVar3 = (allocator<char> *)
                     std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffeb0),
            in_stack_fffffffffffffec8._M_current < paVar3) {
        in_stack_fffffffffffffec0 =
             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)std::__cxx11::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        local_b8 = in_stack_fffffffffffffec0;
        if (((ulong)(in_stack_fffffffffffffec0->
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ).
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
          local_109._9_8_ = local_28;
          in_stack_fffffffffffffeb8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
          local_109._1_8_ = *(undefined8 *)in_stack_fffffffffffffeb8;
          in_stack_fffffffffffffeb0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_109;
          std::allocator<char>::allocator();
          __end_00._M_current._7_1_ = uVar2;
          __end_00._M_current._0_7_ = in_stack_fffffffffffffed8;
          std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffed0._M_current,__beg,__end_00,
                     (allocator<char> *)in_stack_fffffffffffffec8._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_18 + 0x20),(size_type)(local_b0 + -1));
          std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          std::__cxx11::string::operator+=((string *)__beg._M_current,local_d8);
          std::__cxx11::string::~string(local_d8);
          std::__cxx11::string::~string((string *)(local_109 + 0x11));
          std::allocator<char>::~allocator((allocator<char> *)local_109);
          in_stack_fffffffffffffea8 =
               std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
          local_28 = (in_stack_fffffffffffffea8->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current;
          break;
        }
        local_b0 = local_b0 + 1;
      }
      local_a8 = 0;
    }
    else {
      local_a1._9_8_ = local_28;
      local_a1._1_8_ = std::__cxx11::string::cend();
      in_stack_fffffffffffffed0._M_current = local_a1;
      std::allocator<char>::allocator();
      __end._M_current._7_1_ = uVar2;
      __end._M_current._0_7_ = in_stack_fffffffffffffed8;
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffed0._M_current,__beg,__end,
                 (allocator<char> *)in_stack_fffffffffffffec8._M_current);
      std::__cxx11::string::operator+=((string *)__beg._M_current,(string *)(local_a1 + 0x11));
      std::__cxx11::string::~string((string *)(local_a1 + 0x11));
      std::allocator<char>::~allocator((allocator<char> *)local_a1);
      local_a8 = 2;
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x193fc1);
    if (local_a8 != 0) {
      return in_RDI;
    }
  } while( true );
}

Assistant:

static string replaceString(const string& s, const std::pair<std::regex, std::vector<string>>& rr) {
					string r;
					for (auto it = s.cbegin(); it != s.cend();) {
						std::smatch m;
						if (!regex_search(it, s.cend(), m, rr.first)) {
							r += string(it, s.cend());
							break;
						}
						for (size_t i = 1; i < m.size(); i++) {
							auto& submatch = m[i];
							if (!submatch.matched) continue;
							r += string(it, m[i].first) + rr.second[i - 1];
							it = m[i].second;
							break;
						}
					}
					return r;
				}